

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::internal::LegacyTraceId::Write
          (LegacyTraceId *this,LegacyEvent *event,uint32_t event_flags)

{
  ulong uVar1;
  char *__s;
  TrackEvent_LegacyEvent *this_00;
  allocator<char> local_69;
  string local_68;
  uint64_t local_48;
  uint64_t id;
  ulong uStack_38;
  uint32_t scope_flags;
  uint32_t local_1c;
  LegacyEvent *pLStack_18;
  uint32_t event_flags_local;
  LegacyEvent *event_local;
  LegacyTraceId *this_local;
  
  local_1c = event_flags;
  pLStack_18 = event;
  event_local = (LegacyEvent *)this;
  if ((event_flags & 0x180) == 0) {
    id._4_4_ = *(uint *)(this + 0x20) & 0x1802;
    local_48 = *(uint64_t *)(this + 0x18);
    if ((*(long *)this != 0) && (id._4_4_ != 0x1000)) {
      local_48 = perfetto::base::Hash::Combine<unsigned_long&,char_const*const&>
                           (&local_48,(char **)this);
    }
    if (id._4_4_ == 2) {
      protos::pbzero::TrackEvent_LegacyEvent::set_unscoped_id(pLStack_18,local_48);
    }
    else if (id._4_4_ == 0x800) {
      protos::pbzero::TrackEvent_LegacyEvent::set_local_id(pLStack_18,local_48);
    }
    else if (id._4_4_ == 0x1000) {
      protos::pbzero::TrackEvent_LegacyEvent::set_global_id(pLStack_18,local_48);
    }
    this_00 = pLStack_18;
    if (*(long *)this != 0) {
      __s = *(char **)this;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,__s,&local_69);
      protos::pbzero::TrackEvent_LegacyEvent::set_id_scope(this_00,&local_68);
      ::std::__cxx11::string::~string((string *)&local_68);
      ::std::allocator<char>::~allocator(&local_69);
    }
  }
  else if ((*(uint *)(this + 0x20) & 0x800) == 0) {
    protos::pbzero::TrackEvent_LegacyEvent::set_bind_id(event,*(uint64_t *)(this + 0x18));
  }
  else {
    uVar1 = *(ulong *)(this + 0x18);
    ProcessTrack::Current();
    protos::pbzero::TrackEvent_LegacyEvent::set_bind_id(event,uVar1 ^ uStack_38);
  }
  return;
}

Assistant:

void LegacyTraceId::Write(protos::pbzero::TrackEvent::LegacyEvent* event,
                          uint32_t event_flags) const {
  // Legacy flow events always use bind_id.
  if (event_flags &
      (legacy::kTraceEventFlagFlowOut | legacy::kTraceEventFlagFlowIn)) {
    // Flow bind_ids don't have scopes, so we need to mangle in-process ones to
    // avoid collisions.
    if (id_flags_ & legacy::kTraceEventFlagHasLocalId) {
      event->set_bind_id(raw_id_ ^ ProcessTrack::Current().uuid);
    } else {
      event->set_bind_id(raw_id_);
    }
    return;
  }

  uint32_t scope_flags = id_flags_ & (legacy::kTraceEventFlagHasId |
                                      legacy::kTraceEventFlagHasLocalId |
                                      legacy::kTraceEventFlagHasGlobalId);
  uint64_t id = raw_id_;
  if (scope_ && scope_flags != legacy::kTraceEventFlagHasGlobalId) {
    id = base::Hash::Combine(id, scope_);
  }

  switch (scope_flags) {
    case legacy::kTraceEventFlagHasId:
      event->set_unscoped_id(id);
      break;
    case legacy::kTraceEventFlagHasLocalId:
      event->set_local_id(id);
      break;
    case legacy::kTraceEventFlagHasGlobalId:
      event->set_global_id(id);
      break;
  }
  if (scope_)
    event->set_id_scope(scope_);
}